

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

void __thiscall FunctionAnalyser::visit(FunctionAnalyser *this,FunctionSymbol *symbol)

{
  FunctionSymbol *in_RSI;
  list<TypeName,_std::allocator<TypeName>_> *in_RDI;
  list<TypeName,_std::allocator<TypeName>_> *unaff_retaddr;
  TypeName *in_stack_ffffffffffffffd8;
  undefined8 local_18;
  list<TypeName,_std::allocator<TypeName>_> *__x;
  
  *(undefined1 *)
   ((_Storage<TypeName,_true> *)
    &(in_RDI->super__List_base<TypeName,_std::allocator<TypeName>_>)._M_impl._M_node.
     super__List_node_base + 2) = 1;
  __x = in_RDI;
  FunctionSymbol::getArguments_abi_cxx11_(in_RSI);
  std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::operator=(unaff_retaddr,__x);
  FunctionSymbol::getReturnType(in_RSI);
  std::optional<TypeName>::optional<const_TypeName_&,_true>
            ((optional<TypeName> *)in_RDI,in_stack_ffffffffffffffd8);
  *(undefined8 *)
   ((_Storage<TypeName,_true> *)
    &(in_RDI->super__List_base<TypeName,_std::allocator<TypeName>_>)._M_impl._M_node.
     super__List_node_base + 3) = local_18;
  return;
}

Assistant:

void FunctionAnalyser::visit(FunctionSymbol& symbol)
{
  symbolValid_ = true;
  arguments_ = symbol.getArguments();
  returnType_ = symbol.getReturnType();
}